

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::LoopSetInst::Print(LoopSetInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  LoopSetInst *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x36);
  }
  DebugWriter::Print(w,L"LoopSetInst");
  DebugWriter::Print(w,L"(");
  SetMixin<false>::Print(&this->super_SetMixin<false>,w,litbuf);
  DebugWriter::Print(w,L", ");
  BeginLoopBasicsMixin::Print(&this->super_BeginLoopBasicsMixin,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<false>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<false>,L"SetMixin<false>"
              );
    Inst::PrintBytes<UnifiedRegex::BeginLoopBasicsMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BeginLoopBasicsMixin,
               L"BeginLoopBasicsMixin");
    DebugWriter::Unindent(w);
  }
  return 0x36;
}

Assistant:

int LoopSetInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("LoopSetInst");
        PRINT_MIXIN_COMMA(SetMixin<false>);
        PRINT_MIXIN(BeginLoopBasicsMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(BeginLoopBasicsMixin);
        PRINT_RE_BYTECODE_END();
    }